

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<int,_true> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
::binary_search_impl<std::__cxx11::string,phmap::priv::StringBtreeDefaultLess>
          (btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
           *this,undefined8 *k,uint s,uint e,StringBtreeDefaultLess *comp)

{
  weak_ordering wVar1;
  uint uVar2;
  long lVar3;
  template_ElementType<2UL> *ptVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  string_view local_50;
  string_view local_40;
  
  lVar3 = 1;
  uVar8 = (ulong)e;
  while (uVar7 = (uint)uVar8, s != uVar7) {
    uVar2 = (int)(uVar7 + s) >> 1;
    ptVar4 = GetField<2ul>(this);
    local_40._M_str = ptVar4[(int)uVar2].value.first._M_dataplus._M_p;
    local_40._M_len = *(size_t *)((long)ptVar4 + (long)(int)uVar2 * 0x40 + 8);
    local_50._M_str = (char *)*k;
    local_50._M_len = k[1];
    wVar1 = StringBtreeDefaultLess::operator()(comp,&local_40,&local_50);
    uVar6 = uVar2 + 1;
    lVar5 = lVar3;
    if (wVar1.value_ == '\0') {
      lVar5 = 0;
    }
    if (-1 < wVar1.value_) {
      uVar6 = s;
      lVar3 = lVar5;
      uVar7 = uVar2;
    }
    s = uVar6;
    uVar8 = (ulong)uVar7;
  }
  return (SearchResult<int,_true>)(uVar8 | lVar3 << 0x20);
}

Assistant:

SearchResult<int, true> binary_search_impl(
            const K &k, int s, int e, const CompareTo &comp,
            std::true_type /* IsCompareTo */) const {
            if (is_multi_container::value) {
                MatchKind exact_match = MatchKind::kNe;
                while (s != e) {
                    const int mid = (s + e) >> 1;
                    const phmap::weak_ordering c = comp(key(mid), k);
                    if (c < 0) {
                        s = mid + 1;
                    } else {
                        e = mid;
                        if (c == 0) {
                            // Need to return the first value whose key is not less than k,
                            // which requires continuing the binary search if this is a
                            // multi-container.
                            exact_match = MatchKind::kEq;
                        }
                    }
                }
                return {s, exact_match};
            } else {  // Not a multi-container.
                while (s != e) {
                    const int mid = (s + e) >> 1;
                    const phmap::weak_ordering c = comp(key(mid), k);
                    if (c < 0) {
                        s = mid + 1;
                    } else if (c > 0) {
                        e = mid;
                    } else {
                        return {mid, MatchKind::kEq};
                    }
                }
                return {s, MatchKind::kNe};
            }
        }